

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int handle_connection(int fd,ptls_context_t *ctx,char *server_name,
                     ptls_handshake_properties_t *hsprop)

{
  uint __i;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  ptls_t *tls;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  long lVar6;
  size_t sVar7;
  char *__format;
  ulong uVar8;
  size_t local_cf0;
  ptls_handshake_properties_t *local_ce8;
  ptls_buffer_t wbuf;
  fd_set readfds;
  uint8_t rbuf [1024];
  uint8_t early_data [1024];
  uint8_t wbuf_small [1024];
  
  tls = ptls_new(ctx,server_name);
  local_ce8 = hsprop;
  if ((server_name == (char *)0x0) || ((hsprop->client).max_early_data_size == (size_t *)0x0)) {
    sVar7 = 0;
  }
  else {
    sVar3 = read(0,early_data,0x400);
    sVar7 = 0;
    if (0 < (long)sVar3) {
      sVar7 = sVar3;
    }
  }
  wbuf.base = wbuf_small;
  wbuf.off = 0;
  wbuf.capacity = 0x400;
  wbuf.is_allocated = 0;
  sVar4 = 0;
  sVar3 = sVar7;
  while (local_cf0 = sVar4, uVar1 = ptls_handshake(tls,&wbuf,rbuf,&local_cf0,local_ce8),
        uVar1 == 0x202) {
    if ((((sVar3 != 0) && ((local_ce8->client).max_early_data_size != (ulong *)0x0)) &&
        (sVar3 <= *(local_ce8->client).max_early_data_size)) &&
       (uVar1 = ptls_send(tls,&wbuf,early_data,sVar3), uVar1 != 0)) {
      __format = "ptls_send(early_data): %d\n";
      goto LAB_001043f3;
    }
    iVar2 = write_all(fd,wbuf.base,wbuf.off);
    if (iVar2 != 0) goto LAB_001043fa;
    wbuf.off = 0;
    while (sVar4 = read(fd,rbuf,0x400), sVar4 == 0xffffffffffffffff) {
      piVar5 = __errno_location();
      if (*piVar5 != 4) goto LAB_001043fa;
    }
    sVar3 = 0;
    if ((long)sVar4 < 1) goto LAB_001043fa;
  }
  iVar2 = write_all(fd,wbuf.base,wbuf.off);
  if (iVar2 == 0) {
    if (uVar1 != 0) {
      __format = "ptls_handshake:%d\n";
      goto LAB_001043f3;
    }
    sVar4 = sVar4 - local_cf0;
    if (sVar4 == 0) {
      sVar4 = 0;
    }
    else {
      memmove(rbuf,rbuf + local_cf0,sVar4);
    }
    wbuf.off = 0;
    local_cf0 = sVar4;
    if ((sVar7 != 0) && ((*(byte *)((long)local_ce8 + 0x18) & 1) == 0)) {
      uVar1 = ptls_send(tls,&wbuf,early_data,sVar7);
      if (uVar1 != 0) goto LAB_001043e0;
      iVar2 = write_all(fd,wbuf.base,wbuf.off);
      if (iVar2 != 0) goto LAB_001043fa;
    }
    wbuf.off = 0;
    iVar2 = decrypt_and_print(tls,rbuf,local_cf0);
    if (iVar2 == 0) {
      local_cf0 = 0;
      uVar8 = 1L << ((byte)fd & 0x3f);
      goto LAB_001042d3;
    }
  }
LAB_001043fa:
  ptls_buffer_dispose(&wbuf);
  ptls_free(tls);
  return extraout_EAX;
LAB_001042d3:
  do {
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      readfds.__fds_bits[lVar6] = 0;
    }
    readfds.__fds_bits[0]._0_1_ = (byte)readfds.__fds_bits[0] | 1;
    readfds.__fds_bits[fd / 0x40] = readfds.__fds_bits[fd / 0x40] | uVar8;
    iVar2 = select(fd + 1,(fd_set *)&readfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
  } while (iVar2 < 1);
  if (((byte)readfds.__fds_bits[0] & 1) != 0) {
    do {
      sVar7 = read(0,rbuf,0x400);
      if (sVar7 != 1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    uVar1 = ptls_send(tls,&wbuf,rbuf,sVar7);
    if (uVar1 != 0) goto LAB_001043e0;
    iVar2 = write_all(fd,wbuf.base,wbuf.off);
    if (iVar2 != 0) goto LAB_001043fa;
    wbuf.off = 0;
  }
  if ((readfds.__fds_bits[fd / 0x40] & uVar8) != 0) {
    do {
      sVar7 = read(fd,rbuf,0x400);
      if (sVar7 != 1) {
        if ((long)sVar7 < 1) goto LAB_001043fa;
        break;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    iVar2 = decrypt_and_print(tls,rbuf,sVar7);
    if (iVar2 != 0) goto LAB_001043fa;
  }
  goto LAB_001042d3;
LAB_001043e0:
  __format = "ptls_send:%d\n";
LAB_001043f3:
  fprintf(_stderr,__format,(ulong)uVar1);
  goto LAB_001043fa;
}

Assistant:

static int handle_connection(int fd, ptls_context_t *ctx, const char *server_name, ptls_handshake_properties_t *hsprop)
{
    ptls_t *tls = ptls_new(ctx, server_name);
    uint8_t rbuf[1024], wbuf_small[1024], early_data[1024];
    ptls_buffer_t wbuf;
    int ret;
    size_t early_data_size = 0, roff;
    ssize_t rret;

    if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
        /* using early data */
        if ((rret = read(0, early_data, sizeof(early_data))) > 0)
            early_data_size = rret;
    }

    ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));

    roff = sizeof(rbuf);
    if (run_handshake(fd, tls, &wbuf, rbuf, &roff, hsprop, ptls_iovec_init(early_data, early_data_size)) != 0)
        goto Exit;
    wbuf.off = 0;

    /* re-send early data if necessary */
    if (early_data_size != 0 && !hsprop->client.early_data_accepted_by_peer) {
        if ((ret = ptls_send(tls, &wbuf, early_data, early_data_size)) != 0) {
            fprintf(stderr, "ptls_send:%d\n", ret);
            goto Exit;
        }
        if (write_all(fd, wbuf.base, wbuf.off) != 0)
            goto Exit;
        wbuf.off = 0;
    }

    /* process pending post-handshake data (if any) */
    if (decrypt_and_print(tls, rbuf, roff) != 0)
        goto Exit;
    roff = 0;

    /* do the communication */
    while (1) {

        /* wait for either of STDIN or read-side of the socket to become available */
        fd_set readfds;
        FD_ZERO(&readfds);
        FD_SET(0, &readfds);
        FD_SET(fd, &readfds);
        if (select(fd + 1, &readfds, NULL, NULL, NULL) <= 0)
            continue;

        if (FD_ISSET(0, &readfds)) {
            /* read from stdin, encrypt and send */
            while ((rret = read(0, rbuf, sizeof(rbuf))) == 1 && errno == EINTR)
                ;
            if ((ret = ptls_send(tls, &wbuf, rbuf, rret)) != 0) {
                fprintf(stderr, "ptls_send:%d\n", ret);
                goto Exit;
            }
            if (write_all(fd, wbuf.base, wbuf.off) != 0)
                goto Exit;
            wbuf.off = 0;
        }

        if (FD_ISSET(fd, &readfds)) {
            /* read from socket, decrypt and print */
            while ((rret = read(fd, rbuf, sizeof(rbuf))) == 1 && errno == EINTR)
                ;
            if (rret <= 0)
                goto Exit;
            if (decrypt_and_print(tls, rbuf, rret) != 0)
                goto Exit;
        }
    }

Exit:
    ptls_buffer_dispose(&wbuf);
    ptls_free(tls);
    return 0;
}